

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void in2_a2(DisasContext_conflict13 *s,DisasOps *o)

{
  _Bool _Var1;
  int b2;
  int d2;
  TCGv_i64 pTVar2;
  int local_20;
  int x2;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  _Var1 = have_field1(s,FLD_O_x2);
  if (_Var1) {
    local_20 = get_field1(s,FLD_O_x2,FLD_C_d4);
  }
  else {
    local_20 = 0;
  }
  b2 = get_field1(s,FLD_O_b2,FLD_C_b2);
  d2 = get_field1(s,FLD_O_d2,FLD_C_d2);
  pTVar2 = get_address(s,local_20,b2,d2);
  o->in2 = pTVar2;
  return;
}

Assistant:

static void in2_a2(DisasContext *s, DisasOps *o)
{
    int x2 = have_field(s, x2) ? get_field(s, x2) : 0;
    o->in2 = get_address(s, x2, get_field(s, b2), get_field(s, d2));
}